

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

optional<spv::Capability>
spvtools::opt::Handler_OpImageWrite_StorageImageWriteWithoutFormat(Instruction *instruction)

{
  Op OVar1;
  IRContext *this;
  Instruction *this_00;
  Capability local_3c;
  undefined1 local_35;
  uint32_t local_34;
  bool is_unknown;
  Instruction *pIStack_30;
  uint32_t format;
  Instruction *type;
  uint32_t type_index;
  uint32_t image_index;
  DefUseManager *def_use_mgr;
  Instruction *instruction_local;
  
  def_use_mgr = (DefUseManager *)instruction;
  OVar1 = Instruction::opcode(instruction);
  if (OVar1 != OpImageWrite) {
    __assert_fail("instruction->opcode() == spv::Op::OpImageWrite && \"This handler only support OpImageWrite opcodes.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                  ,0x164,
                  "std::optional<spv::Capability> spvtools::opt::Handler_OpImageWrite_StorageImageWriteWithoutFormat(const Instruction *)"
                 );
  }
  this = Instruction::context((Instruction *)def_use_mgr);
  _type_index = IRContext::get_def_use_mgr(this);
  type._4_4_ = Instruction::GetSingleWordInOperand((Instruction *)def_use_mgr,0);
  this_00 = analysis::DefUseManager::GetDef(_type_index,type._4_4_);
  type._0_4_ = Instruction::type_id(this_00);
  pIStack_30 = analysis::DefUseManager::GetDef(_type_index,(uint32_t)type);
  local_34 = Instruction::GetSingleWordInOperand(pIStack_30,6);
  local_35 = local_34 == 0;
  if ((bool)local_35) {
    local_3c = CapabilityStorageImageWriteWithoutFormat;
    std::optional<spv::Capability>::optional<spv::Capability,_true>
              ((optional<spv::Capability> *)&instruction_local,&local_3c);
  }
  else {
    std::optional<spv::Capability>::optional((optional<spv::Capability> *)&instruction_local);
  }
  return (_Optional_base<spv::Capability,_true,_true>)
         (_Optional_base<spv::Capability,_true,_true>)instruction_local;
}

Assistant:

static std::optional<spv::Capability>
Handler_OpImageWrite_StorageImageWriteWithoutFormat(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpImageWrite &&
         "This handler only support OpImageWrite opcodes.");
  const auto* def_use_mgr = instruction->context()->get_def_use_mgr();

  const uint32_t image_index =
      instruction->GetSingleWordInOperand(kOpImageWriteImageIndex);
  const uint32_t type_index = def_use_mgr->GetDef(image_index)->type_id();

  // If the Image Format is Unknown, StorageImageWriteWithoutFormat is required.
  const Instruction* type = def_use_mgr->GetDef(type_index);
  const uint32_t format = type->GetSingleWordInOperand(kOpTypeImageFormatIndex);
  const bool is_unknown = spv::ImageFormat(format) == spv::ImageFormat::Unknown;
  return is_unknown
             ? std::optional(spv::Capability::StorageImageWriteWithoutFormat)
             : std::nullopt;
}